

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O1

void disruptor::test::SequenceBarrier::WaitForCursor_invoker(void)

{
  undefined8 uVar1;
  WaitForCursor t;
  string local_4b0;
  undefined7 uStack_4af;
  undefined1 local_4a0 [16];
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  string local_440;
  undefined7 uStack_43f;
  undefined1 local_430 [96];
  ios_base local_3d0 [264];
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 local_258 [376];
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [88];
  pointer local_78;
  pointer local_50;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_448 = "";
  memset((ostringstream *)local_258,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
  local_d8 = 0;
  local_d0[0] = 0;
  local_440 = (string)0x22;
  local_e0 = local_d0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,(char *)&local_440,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"WaitForCursor",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_e0,&local_440);
  if ((undefined1 *)CONCAT71(uStack_43f,local_440) != local_430) {
    operator_delete((undefined1 *)CONCAT71(uStack_43f,local_440));
  }
  local_268 = local_e0;
  local_260 = local_e0 + local_d8;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x3f);
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
  std::ios_base::~ios_base((ios_base *)(local_258 + 0x70));
  SequenceBarrierFixture::SequenceBarrierFixture((SequenceBarrierFixture *)local_258);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_458 = "";
  memset((ostringstream *)&local_440,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_4b0 = (string)0x22;
  local_2c8 = local_2b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,(char *)&local_4b0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"WaitForCursor",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2c8,&local_4b0);
  if ((undefined1 *)CONCAT71(uStack_4af,local_4b0) != local_4a0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4af,local_4b0));
  }
  local_278 = local_2c8;
  local_270 = local_2c8 + local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_460,0x3f);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
  std::ios_base::~ios_base(local_3d0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_468 = "";
  memset((ostringstream *)&local_440,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_4b0 = (string)0x22;
  local_2c8 = local_2b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,(char *)&local_4b0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"WaitForCursor",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2c8,&local_4b0);
  if ((undefined1 *)CONCAT71(uStack_4af,local_4b0) != local_4a0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4af,local_4b0));
  }
  local_288 = local_2c8;
  local_280 = local_2c8 + local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0x3f);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
  std::ios_base::~ios_base(local_3d0);
  WaitForCursor::test_method((WaitForCursor *)local_258);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_478 = "";
  memset((ostringstream *)&local_440,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_4b0 = (string)0x22;
  local_2c8 = local_2b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,(char *)&local_4b0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"WaitForCursor",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_440,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2c8,&local_4b0);
  if ((undefined1 *)CONCAT71(uStack_4af,local_4b0) != local_4a0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4af,local_4b0));
  }
  local_298 = local_2c8;
  local_290 = local_2c8 + local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x3f);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
  std::ios_base::~ios_base(local_3d0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_488 = "";
  memset((ostringstream *)&local_440,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_4b0 = (string)0x22;
  local_2c8 = local_2b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,(char *)&local_4b0,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"WaitForCursor",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2c8,&local_4b0);
  if ((undefined1 *)CONCAT71(uStack_4af,local_4b0) != local_4a0) {
    operator_delete((undefined1 *)CONCAT71(uStack_4af,local_4b0));
  }
  local_2a8 = local_2c8;
  local_2a0 = local_2c8 + local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_490,0x3f);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
  std::ios_base::~ios_base(local_3d0);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(barrier.WaitFor(kFirstSequenceValue));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);

  std::thread waiter2([this, &return_value]() {
    return_value.store(
        barrier.WaitFor(kFirstSequenceValue + 1L, std::chrono::seconds(5)));
  });

  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();

  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue + 1L);
}